

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_check_pubkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  size_t sVar2;
  mbedtls_rsa_context *ctx_local;
  
  iVar1 = rsa_check_context(ctx,0,0);
  if ((((iVar1 == 0) && (sVar2 = mbedtls_mpi_bitlen(&ctx->N), 0x7f < sVar2)) &&
      (iVar1 = mbedtls_mpi_get_bit(&ctx->E,0), iVar1 != 0)) &&
     ((sVar2 = mbedtls_mpi_bitlen(&ctx->E), 1 < sVar2 &&
      (iVar1 = mbedtls_mpi_cmp_mpi(&ctx->E,&ctx->N), iVar1 < 0)))) {
    return 0;
  }
  return -0x4200;
}

Assistant:

int mbedtls_rsa_check_pubkey( const mbedtls_rsa_context *ctx )
{
    RSA_VALIDATE_RET( ctx != NULL );

    if( rsa_check_context( ctx, 0 /* public */, 0 /* no blinding */ ) != 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( mbedtls_mpi_bitlen( &ctx->N ) < 128 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    if( mbedtls_mpi_get_bit( &ctx->E, 0 ) == 0 ||
        mbedtls_mpi_bitlen( &ctx->E )     < 2  ||
        mbedtls_mpi_cmp_mpi( &ctx->E, &ctx->N ) >= 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    return( 0 );
}